

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O2

void test_qclab_dense_kron<float>(void)

{
  char *in_R9;
  SquareMatrix<float> A;
  SquareMatrix<float> B;
  AssertHelper local_f0;
  Message local_e8;
  SquareMatrix<float> BoA_check;
  SquareMatrix<float> AoB;
  SquareMatrix<float> XoI_check;
  string local_b0;
  AssertionResult gtest_ar__3;
  SquareMatrix<float> BoA;
  SquareMatrix<float> XoI;
  SquareMatrix<float> X;
  SquareMatrix<float> I;
  SquareMatrix<float> AoB_check;
  SquareMatrix<float> IoX_check;
  SquareMatrix<float> IoX;
  
  qclab::dense::SquareMatrix<float>::SquareMatrix(&I,1.0,0.0,0.0,1.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&X,0.0,1.0,1.0,0.0);
  qclab::dense::kron<float>((dense *)&IoX,&I,&X);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&IoX_check,0.0,1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,0.0);
  XoI.size_._0_1_ = qclab::dense::SquareMatrix<float>::operator==(&IoX,&IoX_check);
  XoI.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  if (!(bool)(undefined1)XoI.size_) {
    testing::Message::Message((Message *)&XoI_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&XoI,(AssertionResult *)"IoX == IoX_check","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&XoI_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    std::__cxx11::string::~string((string *)&local_b0);
    if (XoI_check.size_ != 0) {
      (**(code **)(*(long *)XoI_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&XoI.data_);
  qclab::dense::kron<float>((dense *)&XoI,&X,&I);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&XoI_check,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0);
  A.size_._0_1_ = qclab::dense::SquareMatrix<float>::operator==(&XoI,&XoI_check);
  A.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  if (!(bool)(undefined1)A.size_) {
    testing::Message::Message((Message *)&B);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&A,(AssertionResult *)"XoI == XoI_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&AoB,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&AoB,(Message *)&B);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&AoB);
    std::__cxx11::string::~string((string *)&local_b0);
    if (B.size_ != 0) {
      (**(code **)(*(long *)B.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&A.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&A,1.0,2.0,3.0,5.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix(&B,7.0,11.0,13.0,17.0);
  qclab::dense::kron<float>((dense *)&AoB,&A,&B);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&AoB_check,7.0,11.0,14.0,22.0,13.0,17.0,26.0,34.0,21.0,33.0,35.0,55.0,39.0,51.0,65.0,
             85.0);
  BoA.size_._0_1_ = qclab::dense::SquareMatrix<float>::operator==(&AoB,&AoB_check);
  BoA.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  if (!(bool)(undefined1)BoA.size_) {
    testing::Message::Message((Message *)&BoA_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&BoA,(AssertionResult *)"AoB == AoB_check","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&BoA_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&local_b0);
    if (BoA_check.size_ != 0) {
      (**(code **)(*(long *)BoA_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&BoA.data_);
  qclab::dense::kron<float>((dense *)&BoA,&B,&A);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&BoA_check,7.0,14.0,11.0,22.0,21.0,35.0,33.0,55.0,13.0,26.0,17.0,34.0,39.0,65.0,51.0,
             85.0);
  gtest_ar__3.success_ = qclab::dense::SquareMatrix<float>::operator==(&BoA,&BoA_check);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&gtest_ar__3,(AssertionResult *)"BoA == BoA_check","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (local_e8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_e8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&BoA_check.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&BoA.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&AoB_check.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&AoB.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&B.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&A.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&XoI_check.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&XoI.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&IoX_check.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&IoX.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&X.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&I.data_);
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}